

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadSphere.h
# Opt level: O0

void __thiscall
pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>>::GradX<Fad<double>>
          (TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *this,TPZFMatrix<double> *coord,
          TPZVec<Fad<double>_> *param,TPZFMatrix<Fad<double>_> *gradx)

{
  TPZFMatrix<Fad<double>_> *this_00;
  TPZVec<Fad<double>_> *in_RDX;
  Fad<double> *in_RDI;
  TPZFNMatrix<9,_Fad<double>_> DphivDx;
  int i_1;
  Fad<double> phi;
  TPZFNMatrix<9,_Fad<double>_> gradv;
  Fad<double> zero;
  TPZFNMatrix<3,_Fad<double>_> v;
  TPZFNMatrix<3,_Fad<double>_> gradphi;
  TPZFNMatrix<6,_Fad<double>_> dxdqsi;
  int i;
  Fad<double> norm;
  TPZManVector<Fad<double>,_3> xqsiLxc;
  TPZManVector<Fad<double>,_3> xqsi;
  TPZVec<Fad<double>_> *in_stack_00000f98;
  TPZVec<Fad<double>_> *in_stack_00000fa0;
  TPZFMatrix<double> *in_stack_00000fa8;
  TPZGeoBlend<pzgeom::TPZGeoQuad> *in_stack_00000fb0;
  TPZFMatrix<Fad<double>_> *in_stack_000033f8;
  TPZVec<Fad<double>_> *in_stack_00003400;
  TPZFMatrix<double> *in_stack_00003408;
  TPZGeoBlend<pzgeom::TPZGeoQuad> *in_stack_00003410;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffff2f8;
  TPZFNMatrix<9,_Fad<double>_> *in_stack_fffffffffffff300;
  Fad<double> *in_stack_fffffffffffff308;
  TPZManVector<Fad<double>,_3> *in_stack_fffffffffffff310;
  FadExpr<FadFuncSqrt<Fad<double>_>_> *in_stack_fffffffffffff318;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *fadexpr;
  Fad<double> *in_stack_fffffffffffff320;
  TPZVec<Fad<double>_> *this_01;
  Fad<double> *in_stack_fffffffffffff330;
  Fad<double> *in_stack_fffffffffffff338;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffff340;
  Fad<double> *this_02;
  Fad<double> *in_stack_fffffffffffff358;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffff360;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffff368;
  Fad<double> *in_stack_fffffffffffff378;
  int64_t in_stack_fffffffffffff380;
  int64_t in_stack_fffffffffffff388;
  TPZFNMatrix<9,_Fad<double>_> *in_stack_fffffffffffff390;
  Fad<double> *in_stack_fffffffffffff3a0;
  int64_t in_stack_fffffffffffff3a8;
  TPZManVector<Fad<double>,_3> *in_stack_fffffffffffff3b0;
  int in_stack_fffffffffffff3cc;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffff3d0;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffff3d8;
  TPZMatrix<Fad<double>_> *in_stack_fffffffffffff3e0;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffff540;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffff548;
  int local_84c;
  int local_1ac;
  TPZVec<Fad<double>_> local_158 [4];
  undefined8 local_c8;
  Fad<double> local_c0;
  TPZVec<Fad<double>_> local_a0 [4];
  TPZVec<Fad<double>_> *local_18;
  
  local_c8 = 0;
  this_02 = &local_c0;
  local_18 = in_RDX;
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffff310,&in_stack_fffffffffffff308->val_);
  TPZManVector<Fad<double>,_3>::TPZManVector
            (in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0);
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffff300);
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffff310,&in_stack_fffffffffffff308->val_);
  TPZManVector<Fad<double>,_3>::TPZManVector
            (in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0);
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffff300);
  TPZGeoBlend<pzgeom::TPZGeoQuad>::X<Fad<double>>
            (in_stack_00000fb0,in_stack_00000fa8,in_stack_00000fa0,in_stack_00000f98);
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffff310,&in_stack_fffffffffffff308->val_);
  for (local_1ac = 0; local_1ac < 3; local_1ac = local_1ac + 1) {
    in_stack_fffffffffffff338 = TPZVec<Fad<double>_>::operator[](local_a0,(long)local_1ac);
    in_stack_fffffffffffff340 =
         (TPZFMatrix<Fad<double>_> *)
         TPZVec<double>::operator[]((TPZVec<double> *)&in_RDI[0x54].dx_,(long)local_1ac);
    operator-<Fad<double>,_double,_nullptr>(in_stack_fffffffffffff358,(double)this_02);
    TPZVec<Fad<double>_>::operator[](local_158,(long)local_1ac);
    Fad<double>::operator=
              (in_stack_fffffffffffff320,
               (FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *)in_stack_fffffffffffff318);
    FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *)in_stack_fffffffffffff300);
    this_01 = local_158;
    in_stack_fffffffffffff330 = TPZVec<Fad<double>_>::operator[](this_01,(long)local_1ac);
    TPZVec<Fad<double>_>::operator[](this_01,(long)local_1ac);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_fffffffffffff338,in_stack_fffffffffffff330);
    Fad<double>::operator+=
              (in_stack_fffffffffffff330,
               (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)this_01);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff300);
  }
  sqrt<double>(in_stack_fffffffffffff338);
  Fad<double>::operator=(in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  FadExpr<FadFuncSqrt<Fad<double>_>_>::~FadExpr
            ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)in_stack_fffffffffffff300);
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffff310,&in_stack_fffffffffffff308->val_);
  TPZFNMatrix<6,_Fad<double>_>::TPZFNMatrix
            ((TPZFNMatrix<6,_Fad<double>_> *)in_stack_fffffffffffff390,in_stack_fffffffffffff388,
             in_stack_fffffffffffff380,in_stack_fffffffffffff378);
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffff300);
  TPZGeoBlend<pzgeom::TPZGeoQuad>::GradX<Fad<double>>
            (in_stack_00003410,in_stack_00003408,in_stack_00003400,in_stack_000033f8);
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffff310,&in_stack_fffffffffffff308->val_);
  TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix
            ((TPZFNMatrix<3,_Fad<double>_> *)in_stack_fffffffffffff390,in_stack_fffffffffffff388,
             in_stack_fffffffffffff380,in_stack_fffffffffffff378);
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffff300);
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffff310,&in_stack_fffffffffffff308->val_);
  TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix
            ((TPZFNMatrix<3,_Fad<double>_> *)in_stack_fffffffffffff390,in_stack_fffffffffffff388,
             in_stack_fffffffffffff380,in_stack_fffffffffffff378);
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffff300);
  fadexpr = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)0x0;
  this_00 = (TPZFMatrix<Fad<double>_> *)TPZVec<Fad<double>_>::operator[](local_18,0);
  TPZVec<Fad<double>_>::operator[](local_18,(int64_t)fadexpr);
  operator-<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
            (this_02,(FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_RDI);
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff300);
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
            (in_stack_fffffffffffff390,in_stack_fffffffffffff388,in_stack_fffffffffffff380,
             in_stack_fffffffffffff378);
  operator/<double,_Fad<double>,_nullptr>((double)in_RDI,(Fad<double> *)in_stack_fffffffffffff340);
  Fad<double>::Fad<FadBinaryDiv<FadCst<double>,Fad<double>>>
            (this_02,(FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_> *)in_RDI);
  FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff300);
  for (local_84c = 0; local_84c < 3; local_84c = local_84c + 1) {
    TPZVec<Fad<double>_>::operator[](local_158,(long)local_84c);
    operator*<Fad<double>,_double,_nullptr>(in_stack_fffffffffffff358,(double)this_02);
    in_stack_fffffffffffff310 =
         (TPZManVector<Fad<double>,_3> *)
         TPZFMatrix<Fad<double>_>::operator()
                   (this_00,(int64_t)fadexpr,(int64_t)in_stack_fffffffffffff310);
    Fad<double>::operator=
              ((Fad<double> *)this_00,
               (FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)fadexpr);
    FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)in_stack_fffffffffffff300);
    operator+<double,_Fad<double>,_nullptr>((double)in_RDI,(Fad<double> *)in_stack_fffffffffffff340)
    ;
    in_stack_fffffffffffff308 =
         TPZFMatrix<Fad<double>_>::operator()
                   (this_00,(int64_t)fadexpr,(int64_t)in_stack_fffffffffffff310);
    Fad<double>::operator=((Fad<double> *)this_00,fadexpr);
    FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff300);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_fffffffffffff338,in_stack_fffffffffffff330);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff338,
               in_stack_fffffffffffff330);
    operator/<double,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((double)in_RDI,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_fffffffffffff340);
    ::operator-((FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                 *)in_stack_fffffffffffff308);
    TPZVec<Fad<double>_>::operator[](local_158,(long)local_84c);
    operator*<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_fffffffffffff338,in_stack_fffffffffffff330);
    in_stack_fffffffffffff300 =
         (TPZFNMatrix<9,_Fad<double>_> *)
         TPZFMatrix<Fad<double>_>::operator()
                   (this_00,(int64_t)fadexpr,(int64_t)in_stack_fffffffffffff310);
    Fad<double>::operator=
              ((Fad<double> *)this_00,
               (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
                *)fadexpr);
    FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
                *)in_stack_fffffffffffff300);
    FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                *)0x17c3b36);
    FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_fffffffffffff300);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff300);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff300);
  }
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffff310,&in_stack_fffffffffffff308->val_);
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
            (in_stack_fffffffffffff390,in_stack_fffffffffffff388,in_stack_fffffffffffff380,
             in_stack_fffffffffffff378);
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffff300);
  TensorProd<Fad<double>>(in_stack_fffffffffffff548,in_stack_fffffffffffff540);
  Fad<double>::Fad((Fad<double> *)in_stack_fffffffffffff310,in_stack_fffffffffffff308);
  ::operator*(in_RDI,in_stack_fffffffffffff340);
  TPZFMatrix<Fad<double>_>::operator+(in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  TPZFNMatrix<9,_Fad<double>_>::operator=(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)0x17c3ecf);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)0x17c3edc);
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffff300);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)0x17c3ef3);
  TPZMatrix<Fad<double>_>::Multiply
            (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0,
             in_stack_fffffffffffff3cc);
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x17c3f21);
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffff300);
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x17c3f3b);
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffff300);
  TPZFNMatrix<3,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<3,_Fad<double>_> *)0x17c3f55);
  TPZFNMatrix<3,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<3,_Fad<double>_> *)0x17c3f62);
  TPZFNMatrix<6,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<6,_Fad<double>_> *)0x17c3f6f);
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffff300);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_fffffffffffff310);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_fffffffffffff310);
  return;
}

Assistant:

void GradX(TPZFMatrix<REAL> &coord, TPZVec<T> &param, TPZFMatrix<T> &gradx) const
        {
            // will first do dxdqsi and then d(phi*v)/dx, finaly d(phi*v)/dx * dxdqsi, where phi = 1/norm(xqsi - xc) and v = (xqsi - xc) * fR
            
            TPZManVector<T,3> xqsi(3,0.); // will store (x,y,z) from (qsi,eta)
            TPZManVector<T,3> xqsiLxc(3,0.); // will store (x,y,z)-xc
            GeomQuad::X(coord,param,xqsi); // gives the map (qsi,eta) to (x,y,z)
            T norm = 0.;
            for (int i = 0; i < 3; i++) { // Does xqsi-xc and calculates its norm
                xqsiLxc[i] = xqsi[i] - fxc[i];
                norm += xqsiLxc[i] * xqsiLxc[i];
            }
            norm = sqrt(norm);
            
            TPZFNMatrix<6,T> dxdqsi(3,2,0.); // But it is a (3,2) matrix. It is set (3,3) because of the later products
            GeomQuad::GradX(coord,param,dxdqsi);
            
            TPZFNMatrix<3,T> gradphi(3,1,0.), v(3,1,0.); // here phi = 1/norm(xqsi - xc) and v = (xqsi - xc) * fR
            T zero = param[0]-param[0];
            TPZFNMatrix<9,T> gradv(3,3,zero); // here v = (xqsi - xc) * fR
            T phi = 1./norm;
            
            for (int i = 0; i < 3; i++) {
                v(i,0) = xqsiLxc[i] * fR;
                gradv(i,i) = fR+zero;
                gradphi(i,0) = - (1. / (norm*norm*norm) ) * xqsiLxc[i];
            }
            
            TPZFNMatrix <9,T> DphivDx(3,3,0.); // will store d(phi*v)/dx
            DphivDx = TensorProd(v,gradphi) + phi*gradv;
            
            DphivDx.Multiply(dxdqsi, gradx);
        }